

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int Curl_strncasecompare(char *first,char *second,size_t max)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  uchar uVar4;
  
  bVar1 = *first;
  if (bVar1 == 0) {
    uVar2 = 0;
  }
  else {
    pbVar3 = (byte *)(first + 1);
    do {
      if (((ulong)(byte)*second == 0) || (max == 0)) goto LAB_0011bfc2;
      uVar4 = ""[bVar1];
      if (uVar4 != ""[(byte)*second]) goto LAB_0011bfd9;
      max = max - 1;
      second = (char *)((byte *)second + 1);
      bVar1 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar1 != 0);
    bVar1 = 0;
LAB_0011bfc2:
    uVar2 = (ulong)bVar1;
  }
  if (max == 0) {
    return 1;
  }
  uVar4 = ""[uVar2];
LAB_0011bfd9:
  return (int)(uVar4 == ""[(byte)*second]);
}

Assistant:

int Curl_strncasecompare(const char *first, const char *second, size_t max)
{
  while(*first && *second && max) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return Curl_raw_toupper(*first) == Curl_raw_toupper(*second);
}